

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

int mg_dns_encode_name(mbuf *io,char *name,size_t len)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  uchar n;
  size_t local_38;
  
  local_38 = io->len;
  do {
    pcVar2 = strchr(name,0x2e);
    pcVar3 = name + len;
    if (pcVar2 != (char *)0x0) {
      pcVar3 = pcVar2;
    }
    if (0x7f < (long)pcVar3 - (long)name) {
      return -1;
    }
    n = (uchar)((long)pcVar3 - (long)name);
    mbuf_append(io,&n,1);
    mbuf_append(io,name,(ulong)n);
    cVar1 = *pcVar3;
    if (cVar1 == '.') {
      n = n + '\x01';
      cVar1 = *pcVar3;
    }
    name = name + n;
    len = len - n;
  } while (cVar1 != '\0');
  mbuf_append(io,"",1);
  return (int)io->len - (int)local_38;
}

Assistant:

static int mg_dns_encode_name(struct mbuf *io, const char *name, size_t len) {
    const char *s;
    unsigned char n;
    size_t pos = io->len;

    do {
        if ((s = strchr(name, '.')) == NULL) {
            s = name + len;
        }

        if (s - name > 127) {
            return -1; /* TODO(mkm) cover */
        }
        n = s - name;           /* chunk length */
        mbuf_append(io, &n, 1); /* send length */
        mbuf_append(io, name, n);

        if (*s == '.') {
            n++;
        }

        name += n;
        len -= n;
    } while (*s != '\0');
    mbuf_append(io, "\0", 1); /* Mark end of host name */

    return io->len - pos;
}